

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsH<int>
               (char *label_id,int *xs,int *ys,int count,double height,int offset,int stride)

{
  GetterXsYs<int> getter;
  GetterXsYs<int> local_20;
  
  if (count == 0) {
    local_20.Offset = 0;
  }
  else {
    local_20.Offset = (offset % count + count) % count;
  }
  local_20.Xs = xs;
  local_20.Ys = ys;
  local_20.Count = count;
  local_20.Stride = stride;
  PlotBarsHEx<ImPlot::GetterXsYs<int>,double>(label_id,&local_20,height);
  return;
}

Assistant:

void PlotBarsH(const char* label_id, const T* xs, const T* ys, int count, double height, int offset, int stride) {
    GetterXsYs<T> getter(xs,ys,count,offset,stride);
    PlotBarsHEx(label_id, getter, height);
}